

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_rotate.c
# Opt level: O3

void gdImageSkewY(gdImagePtr dst,gdImagePtr src,int uCol,int iOffset,double dWeight,int clrBack,
                 int ignoretransparent)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint color;
  int iVar6;
  undefined8 uVar7;
  uint uVar8;
  code *pcVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  int g;
  int b;
  int a;
  uint uVar15;
  int iVar16;
  
  iVar14 = src->trueColor;
  if (iVar14 == 0) {
    pcVar9 = gdImageGetPixel;
  }
  else {
    pcVar9 = gdImageGetTrueColorPixel;
  }
  if (-1 < iOffset) {
    iVar14 = 0;
    do {
      gdImageSetPixel(dst,uCol,iVar14,clrBack);
      iVar14 = iVar14 + 1;
    } while (iOffset + 1 != iVar14);
    iVar14 = src->trueColor;
  }
  if (iVar14 == 0) {
    uVar4 = src->red[clrBack];
    uVar5 = src->green[clrBack];
    uVar8 = src->blue[clrBack];
    uVar15 = src->alpha[clrBack];
  }
  else {
    uVar4 = (uint)clrBack >> 0x10 & 0xff;
    uVar5 = (uint)clrBack >> 8 & 0xff;
    uVar8 = clrBack & 0xff;
    uVar15 = (uint)clrBack >> 0x18 & 0x7f;
  }
  uVar4 = gdImageColorAllocateAlpha
                    (dst,(int)((double)(int)uVar4 * dWeight),(int)((double)(int)uVar5 * dWeight),
                     (int)((double)(int)uVar8 * dWeight),(int)((double)(int)uVar15 * dWeight));
  if (src->sy < 1) {
    iVar14 = 0;
    uVar4 = 0;
  }
  else {
    iVar14 = 0;
    do {
      uVar7 = (*pcVar9)(src,uCol,iVar14);
      color = (uint)uVar7;
      uVar15 = (uint)((ulong)uVar7 >> 8);
      uVar8 = (uint)((ulong)uVar7 >> 0x10);
      uVar5 = (uint)((ulong)uVar7 >> 0x18);
      if (src->trueColor == 0) {
        uVar10 = src->red[(int)color];
        uVar11 = src->green[(int)color];
        uVar12 = src->blue[(int)color];
        uVar13 = src->alpha[(int)color];
      }
      else {
        uVar10 = uVar8 & 0xff;
        uVar11 = uVar15 & 0xff;
        uVar12 = color & 0xff;
        uVar13 = uVar5 & 0x7f;
      }
      iVar6 = (int)((double)(int)uVar10 * dWeight);
      if (0xfe < (int)((double)(int)uVar10 * dWeight)) {
        iVar6 = 0xff;
      }
      iVar1 = (int)((double)(int)uVar11 * dWeight);
      if (0xfe < (int)((double)(int)uVar11 * dWeight)) {
        iVar1 = 0xff;
      }
      iVar2 = (int)((double)(int)uVar12 * dWeight);
      if (0xfe < (int)((double)(int)uVar12 * dWeight)) {
        iVar2 = 0xff;
      }
      iVar3 = (int)((double)(int)uVar13 * dWeight);
      if (0x7e < (int)((double)(int)uVar13 * dWeight)) {
        iVar3 = 0x7f;
      }
      if (src->trueColor == 0) {
        iVar16 = (src->red[(int)color] - iVar6) + src->red[(int)uVar4];
        g = (src->green[(int)color] - iVar1) + src->green[(int)uVar4];
        b = (src->blue[(int)color] - iVar2) + src->blue[(int)uVar4];
        uVar5 = src->alpha[(int)color];
        uVar4 = src->alpha[(int)uVar4];
      }
      else {
        iVar16 = ((uVar4 >> 0x10 & 0xff) + (uVar8 & 0xff)) - iVar6;
        g = ((uVar4 >> 8 & 0xff) + (uVar15 & 0xff)) - iVar1;
        b = ((uVar4 & 0xff) + (color & 0xff)) - iVar2;
        uVar5 = uVar5 & 0x7f;
        uVar4 = uVar4 >> 0x18 & 0x7f;
      }
      a = (uVar5 - iVar3) + uVar4;
      if (0xfe < iVar16) {
        iVar16 = 0xff;
      }
      if (0xfe < g) {
        g = 0xff;
      }
      if (0xfe < b) {
        b = 0xff;
      }
      if (0x7e < a) {
        a = 0x7f;
      }
      if ((ignoretransparent == 0) || (color != dst->transparent)) {
        color = gdImageColorAllocateAlpha(dst,iVar16,g,b,a);
        if (color == 0xffffffff) {
          color = gdImageColorClosestAlpha(dst,iVar16,g,b,a);
        }
      }
      iVar16 = iOffset + iVar14;
      if ((-1 < iVar16) && (iVar16 < dst->sy)) {
        gdImageSetPixel(dst,uCol,iVar16,color);
      }
      uVar4 = iVar6 * 0x10000 + iVar2 + iVar1 * 0x100 + iVar3 * 0x1000000;
      iVar14 = iVar14 + 1;
    } while (iVar14 < src->sy);
    iVar14 = iVar14 + iOffset + -1;
  }
  iVar6 = dst->sy;
  if (iVar14 < iVar6) {
    gdImageSetPixel(dst,uCol,iVar14,uVar4);
    iVar6 = dst->sy;
  }
  if (iVar14 < iVar6) {
    do {
      gdImageSetPixel(dst,uCol,iVar14,clrBack);
      iVar14 = iVar14 + 1;
    } while (iVar14 < dst->sy);
  }
  return;
}

Assistant:

void gdImageSkewY (gdImagePtr dst, gdImagePtr src, int uCol, int iOffset, double dWeight, int clrBack, int ignoretransparent)
{
	int i, iYPos=0, r, g, b, a;
	FuncPtr f;
	int pxlOldLeft, pxlLeft=0, pxlSrc;

	if (src->trueColor) {
		f = gdImageGetTrueColorPixel;
	} else {
		f = gdImageGetPixel;
	}

	for (i = 0; i<=iOffset; i++) {
		gdImageSetPixel (dst, uCol, i, clrBack);
	}
	r = (int)((double)gdImageRed(src,clrBack) * dWeight);
	g = (int)((double)gdImageGreen(src,clrBack) * dWeight);
	b = (int)((double)gdImageBlue(src,clrBack) * dWeight);
	a = (int)((double)gdImageAlpha(src,clrBack) * dWeight);

	pxlOldLeft = gdImageColorAllocateAlpha(dst, r, g, b, a);

	for (i = 0; i < src->sy; i++) {
		pxlSrc = f (src, uCol, i);
		iYPos = i + iOffset;

		r = (int)((double)gdImageRed(src,pxlSrc) * dWeight);
		g = (int)((double)gdImageGreen(src,pxlSrc) * dWeight);
		b = (int)((double)gdImageBlue(src,pxlSrc) * dWeight);
		a = (int)((double)gdImageAlpha(src,pxlSrc) * dWeight);

		if (r>255) {
        	r = 255;
		}

		if (g>255) {
			g = 255;
		}

		if (b>255) {
    			b = 255;
		}

		if (a>127) {
			a = 127;
		}

		pxlLeft = gdTrueColorAlpha(r, g, b, a);

		r = gdImageRed(src,pxlSrc)   - (r - gdImageRed(src,pxlOldLeft));
		g = gdImageGreen(src,pxlSrc) - (g - gdImageGreen(src,pxlOldLeft));
		b = gdImageBlue(src,pxlSrc)  - (b - gdImageBlue(src,pxlOldLeft));
		a = gdImageAlpha(src,pxlSrc) - (a - gdImageAlpha(src,pxlOldLeft));

		if (r>255) {
        	r = 255;
		}

		if (g>255) {
			g = 255;
		}

		if (b>255) {
    			b = 255;
		}

		if (a>127) {
			a = 127;
		}

		if (ignoretransparent && pxlSrc == dst->transparent) {
			pxlSrc = dst->transparent;
		} else {
			pxlSrc = gdImageColorAllocateAlpha(dst, r, g, b, a);

			if (pxlSrc == -1) {
				pxlSrc = gdImageColorClosestAlpha(dst, r, g, b, a);
			}
		}

		if ((iYPos >= 0) && (iYPos < dst->sy)) {
			gdImageSetPixel (dst, uCol, iYPos, pxlSrc);
		}

		pxlOldLeft = pxlLeft;
	}

	i = iYPos;
	if (i < dst->sy) {
		gdImageSetPixel (dst, uCol, i, pxlLeft);
	}

	i--;
	while (++i < dst->sy) {
		gdImageSetPixel (dst, uCol, i, clrBack);
	}
}